

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qislamiccivilcalendar.cpp
# Opt level: O0

QStringList * QIslamicCivilCalendar::nameList(void)

{
  initializer_list<QString> args;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_3;
  DataPointer *in_stack_fffffffffffffe38;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe40;
  QList<QString> *in_stack_fffffffffffffe68;
  long *plVar1;
  iterator in_stack_fffffffffffffe70;
  long *plVar2;
  size_type in_stack_fffffffffffffe78;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  long local_68 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_80,(Data *)0x0,L"Islamic Civil",0xd);
  QString::QString((QString *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_98,(Data *)0x0,L"islamic-civil",0xd);
  QString::QString((QString *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_b0,(Data *)0x0,L"islamicc",8);
  QString::QString((QString *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_c8,(Data *)0x0,L"Islamic",7);
  QString::QString((QString *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  args._M_len = in_stack_fffffffffffffe78;
  args._M_array = in_stack_fffffffffffffe70;
  QList<QString>::QList(in_stack_fffffffffffffe68,args);
  plVar2 = local_68;
  plVar1 = &local_8;
  do {
    plVar1 = plVar1 + -3;
    QString::~QString((QString *)0x73676e);
  } while (plVar1 != plVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIslamicCivilCalendar::nameList()
{
    return {
        QStringLiteral("Islamic Civil"),
        QStringLiteral("islamic-civil"), // CLDR name
        QStringLiteral("islamicc"), // old CLDR name, still (2018) used by Mozilla
        // Until we have a concrete implementation that knows all the needed ephemerides:
        QStringLiteral("Islamic"),
    };
}